

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtaptestlogger.cpp
# Opt level: O1

void __thiscall QTapTestLogger::QTapTestLogger(QTapTestLogger *this,char *filename)

{
  QAbstractTestLogger::QAbstractTestLogger(&this->super_QAbstractTestLogger,filename);
  (this->super_QAbstractTestLogger)._vptr_QAbstractTestLogger =
       (_func_int **)&PTR__QTapTestLogger_00171408;
  (this->m_firstExpectedFail)._size = 0x200;
  (this->m_firstExpectedFail).buf = (this->m_firstExpectedFail).staticBuf;
  (this->m_firstExpectedFail).staticBuf[0] = '\0';
  (this->m_comments)._size = 0x200;
  (this->m_comments).buf = (this->m_comments).staticBuf;
  (this->m_comments).staticBuf[0] = '\0';
  (this->m_messages)._size = 0x200;
  (this->m_messages).buf = (this->m_messages).staticBuf;
  (this->m_messages).staticBuf[0] = '\0';
  this->m_gatherMessages = false;
  return;
}

Assistant:

QTapTestLogger::QTapTestLogger(const char *filename)
    : QAbstractTestLogger(filename)
{
}